

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O0

int luaB_next(lua_State *L)

{
  int iVar1;
  lua_State *L_local;
  
  luaL_checktype(L,1,5);
  lua_settop(L,2);
  iVar1 = lua_next(L,1);
  if (iVar1 == 0) {
    lua_pushnil(L);
    L_local._4_4_ = 1;
  }
  else {
    L_local._4_4_ = 2;
  }
  return L_local._4_4_;
}

Assistant:

static int luaB_next (lua_State *L) {
  luaL_checktype(L, 1, LUA_TTABLE);
  lua_settop(L, 2);  /* create a 2nd argument if there isn't one */
  if (lua_next(L, 1))
    return 2;
  else {
    lua_pushnil(L);
    return 1;
  }
}